

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O3

void fsnav_free_ref(void)

{
  double *__ptr;
  fsnav_ref *__ptr_00;
  
  if (fsnav->ref != (fsnav_ref *)0x0) {
    fsnav->ref->cfg = (char *)0x0;
    __ptr_00 = fsnav->ref;
    __ptr_00->cfglength = 0;
    __ptr = (__ptr_00->sol).metrics;
    if (__ptr != (double *)0x0) {
      free(__ptr);
      (__ptr_00->sol).metrics = (double *)0x0;
      __ptr_00 = fsnav->ref;
    }
    free(__ptr_00);
    fsnav->ref = (fsnav_ref *)0x0;
  }
  return;
}

Assistant:

void fsnav_free_ref(void)
{
	if (fsnav->ref == NULL)
		return;

	// configuration
	fsnav->ref->cfg = NULL;
	fsnav->ref->cfglength = 0;

	// solution
	fsnav_free_sol(&(fsnav->ref->sol));
	
	// fsnav_ref structure
	free((void*)(fsnav->ref));
	fsnav->ref = NULL;
}